

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_simd(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  int iVar16;
  float *pfVar17;
  ulong uVar18;
  float *pfVar19;
  long lVar20;
  int l;
  int col;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  int iVar27;
  ulong uVar28;
  float *pfVar29;
  int iVar30;
  float *pfVar31;
  uint uVar32;
  ulong uVar33;
  float *pfVar34;
  int iVar35;
  ulong uVar36;
  int row;
  long lVar37;
  float *pfVar38;
  int iVar39;
  float *pfVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar68 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar69 [64];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 in_ZMM7 [64];
  float fVar87;
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM13 [64];
  int local_b8;
  
  pfVar19 = haarResponseY;
  pfVar17 = haarResponseX;
  auVar79._32_32_ = in_ZmmResult._32_32_;
  auVar79._0_32_ = vbroadcastss_avx512vl(ZEXT416((uint)ipoint->scale));
  auVar85 = auVar79._0_16_;
  auVar50._8_4_ = 0x7fffffff;
  auVar50._0_8_ = 0x7fffffff7fffffff;
  auVar50._12_4_ = 0x7fffffff;
  auVar68._16_48_ = auVar79._16_48_;
  auVar41 = vmulss_avx512f(auVar85,auVar85);
  fVar70 = -0.08 / auVar41._0_4_;
  auVar41 = vpternlogd_avx512vl(auVar50,SUB6416(ZEXT464(0x3effffff),0),ZEXT416((uint)ipoint->x),0xca
                               );
  auVar42 = vpternlogd_avx512vl(SUB6416(ZEXT464(0x3effffff),0),auVar50,ZEXT416((uint)ipoint->y),0xe2
                               );
  auVar41 = ZEXT416((uint)(ipoint->x + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar43._0_8_ = (double)auVar41._0_4_;
  auVar43._8_8_ = auVar41._8_8_;
  auVar68._0_16_ = vcvtss2sd_avx512f(auVar85,auVar85);
  auVar69._0_8_ = auVar68._0_8_;
  auVar69._8_56_ = auVar68._8_56_;
  auVar41 = vfmadd231sd_fma(auVar43,auVar69._0_16_,ZEXT816(0x3fe0000000000000));
  auVar46._0_4_ = (float)auVar41._0_8_;
  auVar46._4_12_ = auVar41._4_12_;
  auVar47._8_4_ = 0x3effffff;
  auVar47._0_8_ = 0x3effffff3effffff;
  auVar47._12_4_ = 0x3effffff;
  auVar41 = ZEXT416((uint)(ipoint->y + auVar42._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42._0_8_ = (double)auVar41._0_4_;
  auVar42._8_8_ = auVar41._8_8_;
  auVar41 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar85,auVar46);
  auVar42 = vfmadd231sd_fma(auVar42,auVar69._0_16_,ZEXT816(0x3fe0000000000000));
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  auVar41 = vinsertps_avx512f(auVar41,auVar85,0x10);
  auVar44._0_4_ = (float)auVar42._0_8_;
  auVar44._4_12_ = auVar42._4_12_;
  auVar42 = vpternlogd_avx512vl(auVar48,auVar41,auVar47,0xea);
  auVar45._0_4_ = auVar41._0_4_ + auVar42._0_4_;
  auVar45._4_4_ = auVar41._4_4_ + auVar42._4_4_;
  auVar45._8_4_ = auVar41._8_4_ + auVar42._8_4_;
  auVar45._12_4_ = auVar41._12_4_ + auVar42._12_4_;
  auVar41 = vroundps_avx(auVar45,0xb);
  auVar49._0_4_ = (int)auVar41._0_4_;
  auVar49._4_4_ = (int)auVar41._4_4_;
  auVar49._8_4_ = (int)auVar41._8_4_;
  auVar49._12_4_ = (int)auVar41._12_4_;
  auVar42 = vpshufd_avx(auVar49,0x55);
  auVar41 = vcvtdq2ps_avx(auVar42);
  fVar72 = auVar46._0_4_ - auVar41._0_4_;
  fVar2 = auVar44._0_4_ - auVar41._0_4_;
  if (auVar49._4_4_ < auVar49._0_4_) {
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar41 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar85,auVar44);
    auVar43 = vpternlogd_avx512vl(auVar51,auVar41,auVar47,0xea);
    auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar43._0_4_));
    auVar41 = vroundss_avx(auVar41,auVar41,0xb);
    if (auVar49._4_4_ < (int)auVar41._0_4_) {
      auVar41 = vfmadd231ss_avx512f(auVar46,auVar85,ZEXT416(0x41300000));
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar43 = vpternlogd_avx512vl(auVar52,auVar41,auVar47,0xea);
      auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar43._0_4_));
      auVar41 = vroundss_avx(auVar41,auVar41,0xb);
      if ((int)auVar41._0_4_ + auVar49._4_4_ <= iimage->width) {
        auVar43 = vfmadd231ss_avx512f(auVar44,auVar85,ZEXT416(0x41300000));
        auVar41._8_4_ = 0x80000000;
        auVar41._0_8_ = 0x8000000080000000;
        auVar41._12_4_ = 0x80000000;
        auVar41 = vpternlogd_avx512vl(auVar47,auVar43,auVar41,0xf8);
        auVar41 = ZEXT416((uint)(auVar43._0_4_ + auVar41._0_4_));
        auVar41 = vroundss_avx(auVar41,auVar41,0xb);
        if ((int)auVar41._0_4_ + auVar49._4_4_ <= iimage->height) {
          auVar54 = vmulps_avx512vl(auVar79._0_32_,(undefined1  [32])kk0_inner_arrays_simd);
          auVar55 = vmulps_avx512vl(auVar79._0_32_,(undefined1  [32])kk1_inner_arrays_simd);
          auVar56 = vmulps_avx512vl(auVar79._0_32_,(undefined1  [32])kk2_inner_arrays_simd);
          auVar14 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
          auVar57 = vpbroadcastq_avx512vl(auVar42);
          iVar22 = -0xc;
          lVar20 = 0x40;
          fVar72 = fVar72 + 0.5;
          auVar41 = vaddss_avx512f(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar2));
          auVar58._0_4_ = (int)(fVar72 + auVar56._0_4_);
          auVar58._4_4_ = (int)(fVar72 + auVar56._4_4_);
          auVar58._8_4_ = (int)(fVar72 + auVar56._8_4_);
          auVar58._12_4_ = (int)(fVar72 + auVar56._12_4_);
          auVar58._16_4_ = (int)(fVar72 + auVar56._16_4_);
          auVar58._20_4_ = (int)(fVar72 + auVar56._20_4_);
          auVar58._24_4_ = (int)(fVar72 + auVar56._24_4_);
          auVar58._28_4_ = (int)(fVar72 + auVar56._28_4_);
          auVar56._0_4_ = (int)(fVar72 + auVar54._0_4_);
          auVar56._4_4_ = (int)(fVar72 + auVar54._4_4_);
          auVar56._8_4_ = (int)(fVar72 + auVar54._8_4_);
          auVar56._12_4_ = (int)(fVar72 + auVar54._12_4_);
          auVar56._16_4_ = (int)(fVar72 + auVar54._16_4_);
          auVar56._20_4_ = (int)(fVar72 + auVar54._20_4_);
          auVar56._24_4_ = (int)(fVar72 + auVar54._24_4_);
          auVar56._28_4_ = (int)(fVar72 + auVar54._28_4_);
          auVar54._0_4_ = (int)(fVar72 + auVar55._0_4_);
          auVar54._4_4_ = (int)(fVar72 + auVar55._4_4_);
          auVar54._8_4_ = (int)(fVar72 + auVar55._8_4_);
          auVar54._12_4_ = (int)(fVar72 + auVar55._12_4_);
          auVar54._16_4_ = (int)(fVar72 + auVar55._16_4_);
          auVar54._20_4_ = (int)(fVar72 + auVar55._20_4_);
          auVar54._24_4_ = (int)(fVar72 + auVar55._24_4_);
          auVar54._28_4_ = (int)(fVar72 + auVar55._28_4_);
          auVar55 = vpaddd_avx512vl(auVar56,auVar14);
          auVar54 = vpaddd_avx2(auVar14,auVar54);
          auVar14 = vpaddd_avx2(auVar58,auVar14);
          auVar56 = vpaddd_avx512vl(auVar55,auVar57);
          auVar58 = vpaddd_avx512vl(auVar54,auVar57);
          auVar59 = vpaddd_avx512vl(auVar14,auVar57);
          auVar60 = vpaddd_avx512vl(auVar56,auVar57);
          auVar61 = vpaddd_avx512vl(auVar58,auVar57);
          auVar62 = vpaddd_avx512vl(auVar59,auVar57);
          do {
            auVar53._0_4_ = (float)iVar22;
            auVar53._4_12_ = in_ZMM13._4_12_;
            iVar16 = iimage->data_width;
            auVar78._4_4_ = iVar16;
            auVar78._0_4_ = iVar16;
            auVar78._8_4_ = iVar16;
            auVar78._12_4_ = iVar16;
            auVar78._16_4_ = iVar16;
            auVar78._20_4_ = iVar16;
            auVar78._24_4_ = iVar16;
            auVar78._28_4_ = iVar16;
            auVar83 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
            iVar22 = iVar22 + 1;
            vfmadd213ss_avx512f(auVar53,auVar85,auVar41);
            auVar63 = vpbroadcastd_avx512vl();
            auVar67 = vpmulld_avx2(auVar78,auVar63);
            auVar64 = vpaddd_avx512vl(auVar63,auVar57);
            auVar65 = vpmulld_avx512vl(auVar78,auVar64);
            auVar66 = vpaddd_avx512vl(auVar64,auVar57);
            in_ZMM13 = ZEXT3264(auVar66);
            auVar86 = vpmulld_avx2(auVar78,auVar66);
            vpaddd_avx512vl(auVar67,auVar55);
            vpaddd_avx512vl(auVar67,auVar56);
            auVar67 = vpaddd_avx512vl(auVar67,auVar60);
            auVar81 = vgatherdps(ZEXT832(0) << 0x40,auVar83);
            vpaddd_avx512vl(auVar65,auVar55);
            vpaddd_avx512vl(auVar65,auVar60);
            vpaddd_avx512vl(auVar86,auVar55);
            vpaddd_avx512vl(auVar86,auVar56);
            vpaddd_avx512vl(auVar86,auVar60);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar78 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2(auVar67,auVar67);
            auVar86 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar67 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vsubps_avx(auVar86,auVar83);
            auVar67 = vgatherdps(ZEXT832(0) << 0x20,auVar67);
            auVar86 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar67 = vsubps_avx(auVar67,auVar65);
            auVar86 = vgatherdps(ZEXT832(0) << 0x20,auVar86);
            auVar65 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vsubps_avx(auVar78,auVar86);
            auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar65);
            auVar65 = vsubps_avx(auVar65,auVar81);
            auVar81 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar78 = vsubps_avx(auVar65,auVar67);
            pfVar34 = (float *)((long)pfVar17 + lVar20 + -0x40);
            *pfVar34 = auVar86._0_4_ + auVar86._0_4_ + auVar67._0_4_ + auVar65._0_4_;
            pfVar34[1] = auVar86._4_4_ + auVar86._4_4_ + auVar67._4_4_ + auVar65._4_4_;
            pfVar34[2] = auVar86._8_4_ + auVar86._8_4_ + auVar67._8_4_ + auVar65._8_4_;
            pfVar34[3] = auVar86._12_4_ + auVar86._12_4_ + auVar67._12_4_ + auVar65._12_4_;
            pfVar34[4] = auVar86._16_4_ + auVar86._16_4_ + auVar67._16_4_ + auVar65._16_4_;
            pfVar34[5] = auVar86._20_4_ + auVar86._20_4_ + auVar67._20_4_ + auVar65._20_4_;
            pfVar34[6] = auVar86._24_4_ + auVar86._24_4_ + auVar67._24_4_ + auVar65._24_4_;
            pfVar34[7] = auVar86._28_4_ + auVar86._28_4_ + auVar67._28_4_ + auVar65._28_4_;
            pfVar34 = (float *)((long)pfVar19 + lVar20 + -0x40);
            *pfVar34 = auVar83._0_4_ + auVar83._0_4_ + auVar78._0_4_;
            pfVar34[1] = auVar83._4_4_ + auVar83._4_4_ + auVar78._4_4_;
            pfVar34[2] = auVar83._8_4_ + auVar83._8_4_ + auVar78._8_4_;
            pfVar34[3] = auVar83._12_4_ + auVar83._12_4_ + auVar78._12_4_;
            pfVar34[4] = auVar83._16_4_ + auVar83._16_4_ + auVar78._16_4_;
            pfVar34[5] = auVar83._20_4_ + auVar83._20_4_ + auVar78._20_4_;
            pfVar34[6] = auVar83._24_4_ + auVar83._24_4_ + auVar78._24_4_;
            pfVar34[7] = auVar83._28_4_ + auVar83._28_4_ + auVar78._28_4_;
            iVar16 = iimage->data_width;
            auVar86._4_4_ = iVar16;
            auVar86._0_4_ = iVar16;
            auVar86._8_4_ = iVar16;
            auVar86._12_4_ = iVar16;
            auVar86._16_4_ = iVar16;
            auVar86._20_4_ = iVar16;
            auVar86._24_4_ = iVar16;
            auVar86._28_4_ = iVar16;
            auVar83 = vpmulld_avx2(auVar86,auVar63);
            auVar67 = vpmulld_avx2(auVar86,auVar64);
            auVar86 = vpmulld_avx2(auVar86,auVar66);
            vpaddd_avx2(auVar83,auVar54);
            vpaddd_avx512vl(auVar83,auVar58);
            vpaddd_avx512vl(auVar83,auVar61);
            vpaddd_avx2(auVar67,auVar54);
            vpaddd_avx512vl(auVar67,auVar61);
            vpaddd_avx2(auVar86,auVar54);
            vpaddd_avx512vl(auVar86,auVar58);
            vpaddd_avx512vl(auVar86,auVar61);
            auVar81 = vgatherdps(ZEXT832(0) << 0x20,auVar81);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar78 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar67 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vsubps_avx(auVar86,auVar83);
            auVar67 = vgatherdps(ZEXT832(0) << 0x20,auVar67);
            auVar86 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar67 = vsubps_avx(auVar67,auVar65);
            auVar86 = vgatherdps(ZEXT832(0) << 0x20,auVar86);
            auVar65 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vsubps_avx(auVar78,auVar86);
            auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar65);
            auVar65 = vsubps_avx(auVar65,auVar81);
            auVar78 = vsubps_avx(auVar65,auVar67);
            pfVar34 = (float *)((long)pfVar17 + lVar20 + -0x20);
            *pfVar34 = auVar86._0_4_ + auVar86._0_4_ + auVar67._0_4_ + auVar65._0_4_;
            pfVar34[1] = auVar86._4_4_ + auVar86._4_4_ + auVar67._4_4_ + auVar65._4_4_;
            pfVar34[2] = auVar86._8_4_ + auVar86._8_4_ + auVar67._8_4_ + auVar65._8_4_;
            pfVar34[3] = auVar86._12_4_ + auVar86._12_4_ + auVar67._12_4_ + auVar65._12_4_;
            pfVar34[4] = auVar86._16_4_ + auVar86._16_4_ + auVar67._16_4_ + auVar65._16_4_;
            pfVar34[5] = auVar86._20_4_ + auVar86._20_4_ + auVar67._20_4_ + auVar65._20_4_;
            pfVar34[6] = auVar86._24_4_ + auVar86._24_4_ + auVar67._24_4_ + auVar65._24_4_;
            pfVar34[7] = auVar86._28_4_ + auVar86._28_4_ + auVar67._28_4_ + auVar65._28_4_;
            pfVar34 = (float *)((long)pfVar19 + lVar20 + -0x20);
            *pfVar34 = auVar83._0_4_ + auVar83._0_4_ + auVar78._0_4_;
            pfVar34[1] = auVar83._4_4_ + auVar83._4_4_ + auVar78._4_4_;
            pfVar34[2] = auVar83._8_4_ + auVar83._8_4_ + auVar78._8_4_;
            pfVar34[3] = auVar83._12_4_ + auVar83._12_4_ + auVar78._12_4_;
            pfVar34[4] = auVar83._16_4_ + auVar83._16_4_ + auVar78._16_4_;
            pfVar34[5] = auVar83._20_4_ + auVar83._20_4_ + auVar78._20_4_;
            pfVar34[6] = auVar83._24_4_ + auVar83._24_4_ + auVar78._24_4_;
            pfVar34[7] = auVar83._28_4_ + auVar83._28_4_ + auVar78._28_4_;
            iVar16 = iimage->data_width;
            auVar65._4_4_ = iVar16;
            auVar65._0_4_ = iVar16;
            auVar65._8_4_ = iVar16;
            auVar65._12_4_ = iVar16;
            auVar65._16_4_ = iVar16;
            auVar65._20_4_ = iVar16;
            auVar65._24_4_ = iVar16;
            auVar65._28_4_ = iVar16;
            auVar67 = vpmulld_avx2(auVar65,auVar63);
            auVar86 = vpmulld_avx2(auVar65,auVar64);
            auVar83 = vpcmpeqd_avx2(auVar64,auVar64);
            auVar65 = vpmulld_avx2(auVar65,auVar66);
            vpaddd_avx2(auVar14,auVar67);
            vpaddd_avx512vl(auVar67,auVar59);
            vpaddd_avx2(auVar62,auVar67);
            vpaddd_avx2(auVar14,auVar86);
            vpaddd_avx2(auVar62,auVar86);
            vpaddd_avx2(auVar14,auVar65);
            vpaddd_avx512vl(auVar65,auVar59);
            vpaddd_avx2(auVar62,auVar65);
            auVar81 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar78 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar83 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vgatherdps(ZEXT832(0) << 0x20,auVar83);
            auVar67 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vsubps_avx(auVar86,auVar83);
            auVar67 = vgatherdps(ZEXT832(0) << 0x20,auVar67);
            auVar86 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar67 = vsubps_avx(auVar67,auVar65);
            auVar86 = vgatherdps(ZEXT832(0) << 0x20,auVar86);
            in_ZMM7 = ZEXT3264(auVar86);
            auVar65 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vsubps_avx(auVar78,auVar86);
            auVar65 = vgatherdps(ZEXT832(0) << 0x20,auVar65);
            auVar65 = vsubps_avx(auVar65,auVar81);
            auVar78 = vsubps_avx(auVar65,auVar67);
            pfVar34 = (float *)((long)pfVar17 + lVar20);
            *pfVar34 = auVar86._0_4_ + auVar86._0_4_ + auVar67._0_4_ + auVar65._0_4_;
            pfVar34[1] = auVar86._4_4_ + auVar86._4_4_ + auVar67._4_4_ + auVar65._4_4_;
            pfVar34[2] = auVar86._8_4_ + auVar86._8_4_ + auVar67._8_4_ + auVar65._8_4_;
            pfVar34[3] = auVar86._12_4_ + auVar86._12_4_ + auVar67._12_4_ + auVar65._12_4_;
            pfVar34[4] = auVar86._16_4_ + auVar86._16_4_ + auVar67._16_4_ + auVar65._16_4_;
            pfVar34[5] = auVar86._20_4_ + auVar86._20_4_ + auVar67._20_4_ + auVar65._20_4_;
            pfVar34[6] = auVar86._24_4_ + auVar86._24_4_ + auVar67._24_4_ + auVar65._24_4_;
            pfVar34[7] = auVar86._28_4_ + auVar86._28_4_ + auVar67._28_4_ + auVar65._28_4_;
            pfVar34 = (float *)((long)pfVar19 + lVar20);
            *pfVar34 = auVar83._0_4_ + auVar83._0_4_ + auVar78._0_4_;
            pfVar34[1] = auVar83._4_4_ + auVar83._4_4_ + auVar78._4_4_;
            pfVar34[2] = auVar83._8_4_ + auVar83._8_4_ + auVar78._8_4_;
            pfVar34[3] = auVar83._12_4_ + auVar83._12_4_ + auVar78._12_4_;
            pfVar34[4] = auVar83._16_4_ + auVar83._16_4_ + auVar78._16_4_;
            pfVar34[5] = auVar83._20_4_ + auVar83._20_4_ + auVar78._20_4_;
            pfVar34[6] = auVar83._24_4_ + auVar83._24_4_ + auVar78._24_4_;
            pfVar34[7] = auVar83._28_4_ + auVar83._28_4_ + auVar78._28_4_;
            lVar20 = lVar20 + 0x60;
          } while (lVar20 != 0x940);
          goto LAB_0018884d;
        }
      }
    }
  }
  iVar22 = auVar49._4_4_ * 2;
  iVar16 = -0xc;
  lVar24 = 0;
  lVar20 = 0;
  do {
    auVar73._0_4_ = (float)iVar16;
    auVar73._4_12_ = in_ZMM7._4_12_;
    auVar41 = vfmadd213ss_avx512f(auVar73,auVar85,ZEXT416((uint)fVar2));
    fVar71 = auVar41._0_4_;
    lVar37 = 0;
    row = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                        (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
    pfVar17 = haarResponseX;
    pfVar19 = haarResponseY;
    lVar23 = lVar24;
    do {
      auVar74._0_4_ = (float)((int)lVar37 + -0xc);
      auVar74._4_12_ = in_ZMM7._4_12_;
      auVar41 = vfmadd213ss_avx512f(auVar74,auVar85,ZEXT416((uint)fVar72));
      fVar71 = auVar41._0_4_;
      col = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                          (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      if ((((row < 1) || (col < 1)) || (iimage->height < iVar22 + row)) ||
         (iVar30 = iVar22 + col, iimage->width < iVar30)) {
        haarXY(iimage,row,col,auVar49._4_4_,(float *)((long)pfVar17 + lVar23),
               (float *)((long)pfVar19 + lVar23));
        pfVar17 = haarResponseX;
        pfVar19 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        pfVar34 = iimage->data;
        iVar1 = col + -1 + auVar49._4_4_;
        iVar27 = iVar35 * (row + -1);
        iVar39 = iVar35 * (row + -1 + auVar49._4_4_);
        iVar35 = iVar35 * (iVar22 + -1 + row);
        fVar71 = pfVar34[iVar35 + -1 + col];
        fVar3 = pfVar34[iVar27 + -1 + iVar30];
        auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar27 + iVar1] - pfVar34[iVar35 + iVar1]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar34[iVar35 + -1 + iVar30] -
                                                pfVar34[iVar27 + -1 + col])));
        auVar42 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar39 + -1 + col] -
                                                pfVar34[iVar39 + -1 + iVar30])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar34[iVar35 + -1 + iVar30] -
                                                pfVar34[iVar27 + -1 + col])));
        *(float *)((long)pfVar17 + lVar23) = (fVar71 - fVar3) + auVar41._0_4_;
        *(float *)((long)pfVar19 + lVar23) = auVar42._0_4_ - (fVar71 - fVar3);
      }
      lVar37 = lVar37 + 1;
      lVar23 = lVar23 + 4;
    } while (lVar37 != 0x18);
    iVar16 = iVar16 + 1;
    lVar20 = lVar20 + 1;
    lVar24 = lVar24 + 0x60;
  } while (lVar20 != 0x18);
LAB_0018884d:
  auVar41 = vmulss_avx512f(auVar85,ZEXT416(0x3f000000));
  auVar76._8_4_ = 0x3effffff;
  auVar76._0_8_ = 0x3effffff3effffff;
  auVar76._12_4_ = 0x3effffff;
  auVar75._8_4_ = 0x80000000;
  auVar75._0_8_ = 0x8000000080000000;
  auVar75._12_4_ = 0x80000000;
  auVar42 = vpternlogd_avx512vl(auVar76,auVar41,auVar75,0xf8);
  auVar43 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
  auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar76,auVar43,auVar75,0xf8);
  auVar44 = vmulss_avx512f(auVar85,ZEXT416(0x40200000));
  auVar42 = ZEXT416((uint)(auVar43._0_4_ + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar76,auVar44,auVar75,0xf8);
  auVar45 = vmulss_avx512f(auVar85,ZEXT416(0x40600000));
  auVar43 = ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar76,auVar45,auVar75,0xf8);
  auVar46 = vmulss_avx512f(auVar85,ZEXT416(0x40900000));
  auVar44 = ZEXT416((uint)(auVar45._0_4_ + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar76,auVar46,auVar75,0xf8);
  auVar47 = vmulss_avx512f(auVar85,ZEXT416(0x40b00000));
  auVar45 = ZEXT416((uint)(auVar46._0_4_ + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar76,auVar47,auVar75,0xf8);
  auVar48 = vmulss_avx512f(auVar85,ZEXT416(0x40d00000));
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar76,auVar48,auVar75,0xf8);
  auVar49 = vmulss_avx512f(auVar85,ZEXT416(0x40f00000));
  auVar47 = ZEXT416((uint)(auVar48._0_4_ + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar76,auVar49,auVar75,0xf8);
  auVar50 = vmulss_avx512f(auVar85,ZEXT416(0x41080000));
  auVar48 = ZEXT416((uint)(auVar49._0_4_ + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar76,auVar50,auVar75,0xf8);
  auVar51 = vmulss_avx512f(auVar85,ZEXT416(0x41180000));
  auVar49 = ZEXT416((uint)(auVar50._0_4_ + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar76,auVar51,auVar75,0xf8);
  auVar52 = vmulss_avx512f(auVar85,ZEXT416(0x41280000));
  auVar50 = ZEXT416((uint)(auVar51._0_4_ + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar76,auVar52,auVar75,0xf8);
  auVar53 = vmulss_avx512f(auVar85,ZEXT416(0x41380000));
  auVar85 = ZEXT416((uint)(auVar52._0_4_ + auVar51._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar51 = vpternlogd_avx512vl(auVar76,auVar53,auVar75,0xf8);
  fVar84 = auVar43._0_4_;
  fVar72 = fVar84 + auVar41._0_4_;
  fVar2 = fVar84 + auVar42._0_4_;
  fVar71 = fVar84 - auVar41._0_4_;
  fVar3 = fVar84 - auVar42._0_4_;
  fVar4 = fVar84 - auVar44._0_4_;
  auVar41 = ZEXT416((uint)(auVar53._0_4_ + auVar51._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  fVar5 = fVar84 - auVar46._0_4_;
  fVar87 = auVar48._0_4_;
  fVar6 = fVar87 - auVar41._0_4_;
  fVar7 = fVar84 - auVar45._0_4_;
  fVar8 = fVar87 - auVar44._0_4_;
  fVar84 = fVar84 - auVar47._0_4_;
  fVar9 = fVar87 - auVar45._0_4_;
  fVar10 = fVar87 - auVar46._0_4_;
  fVar11 = fVar87 - auVar47._0_4_;
  fVar12 = fVar87 - auVar49._0_4_;
  fVar13 = fVar87 - auVar50._0_4_;
  fVar87 = fVar87 - auVar85._0_4_;
  gauss_s1_c0[0] = expf(fVar2 * fVar2 * fVar70);
  gauss_s1_c0[1] = expf(fVar72 * fVar72 * fVar70);
  gauss_s1_c0[2] = expf(fVar71 * fVar71 * fVar70);
  gauss_s1_c0[3] = expf(fVar3 * fVar3 * fVar70);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar4 * fVar4 * fVar70);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar70);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar70);
  gauss_s1_c0[8] = expf(fVar84 * fVar84 * fVar70);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar70);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar70);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar70);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar70);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar70);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar70);
  gauss_s1_c1[7] = expf(fVar87 * fVar87 * fVar70);
  gauss_s1_c1[8] = expf(fVar6 * fVar6 * fVar70);
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  uVar33 = 0xfffffff8;
  fVar72 = 0.0;
  lVar20 = 0;
  local_b8 = 0;
  pfVar17 = haarResponseY;
  pfVar19 = haarResponseX;
  do {
    uVar32 = (uint)uVar33;
    pfVar34 = gauss_s1_c0;
    lVar24 = (long)local_b8;
    lVar20 = (long)(int)lVar20;
    uVar21 = 0xfffffff8;
    if (uVar32 == 7) {
      pfVar34 = gauss_s1_c1;
    }
    if (uVar32 == 0xfffffff8) {
      pfVar34 = gauss_s1_c1;
    }
    uVar36 = 0;
    local_b8 = local_b8 + 4;
    pfVar25 = pfVar17;
    pfVar29 = pfVar19;
    do {
      pfVar31 = gauss_s1_c0;
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar21 == 7) {
        pfVar31 = gauss_s1_c1;
      }
      if (uVar21 == 0xfffffff8) {
        pfVar31 = gauss_s1_c1;
      }
      uVar18 = (ulong)(uVar21 >> 0x1c & 0xfffffff8);
      pfVar26 = pfVar25;
      uVar28 = uVar36;
      pfVar38 = pfVar29;
      do {
        lVar23 = 0;
        pfVar40 = (float *)((long)pfVar34 + (ulong)(uint)((int)(uVar33 >> 0x1f) << 5));
        do {
          fVar2 = pfVar31[uVar18] * *pfVar40;
          pfVar40 = pfVar40 + (ulong)(~uVar32 >> 0x1f) * 2 + -1;
          auVar41 = vinsertps_avx(ZEXT416((uint)pfVar26[lVar23]),ZEXT416((uint)pfVar38[lVar23]),0x10
                                 );
          lVar23 = lVar23 + 1;
          auVar82._0_4_ = fVar2 * auVar41._0_4_;
          auVar82._4_4_ = fVar2 * auVar41._4_4_;
          auVar82._8_4_ = fVar2 * auVar41._8_4_;
          auVar82._12_4_ = fVar2 * auVar41._12_4_;
          auVar41 = vandps_avx(auVar82,auVar85);
          auVar41 = vmovlhps_avx(auVar82,auVar41);
          auVar77._0_4_ = auVar79._0_4_ + auVar41._0_4_;
          auVar77._4_4_ = auVar79._4_4_ + auVar41._4_4_;
          auVar77._8_4_ = auVar79._8_4_ + auVar41._8_4_;
          auVar77._12_4_ = auVar79._12_4_ + auVar41._12_4_;
          auVar79 = ZEXT1664(auVar77);
        } while (lVar23 != 9);
        uVar28 = uVar28 + 0x18;
        uVar18 = uVar18 + (ulong)(-1 < (int)uVar21) * 2 + -1;
        pfVar38 = pfVar38 + 0x18;
        pfVar26 = pfVar26 + 0x18;
      } while (uVar28 < uVar21 * 0x18 + 0x198);
      uVar21 = uVar21 + 5;
      uVar36 = uVar36 + 0x78;
      fVar2 = gauss_s2_arr[lVar24];
      auVar15._4_4_ = fVar2;
      auVar15._0_4_ = fVar2;
      auVar15._8_4_ = fVar2;
      auVar15._12_4_ = fVar2;
      auVar44 = vmulps_avx512vl(auVar77,auVar15);
      lVar24 = lVar24 + 1;
      auVar80._0_4_ = auVar44._0_4_ * auVar44._0_4_;
      auVar80._4_4_ = auVar44._4_4_ * auVar44._4_4_;
      auVar80._8_4_ = auVar44._8_4_ * auVar44._8_4_;
      auVar80._12_4_ = auVar44._12_4_ * auVar44._12_4_;
      auVar42 = vshufpd_avx(auVar44,auVar44,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar20) = auVar44;
      lVar20 = lVar20 + 4;
      pfVar29 = pfVar29 + 0x78;
      pfVar25 = pfVar25 + 0x78;
      auVar41 = vmovshdup_avx(auVar80);
      auVar43 = vfmadd231ss_fma(auVar41,auVar44,auVar44);
      auVar41 = vshufps_avx(auVar44,auVar44,0xff);
      auVar42 = vfmadd213ss_fma(auVar42,auVar42,auVar43);
      auVar41 = vfmadd213ss_fma(auVar41,auVar41,auVar42);
      fVar72 = fVar72 + auVar41._0_4_;
    } while (local_b8 != (int)lVar24);
    pfVar19 = pfVar19 + 5;
    pfVar17 = pfVar17 + 5;
    uVar33 = (ulong)(uVar32 + 5);
  } while ((int)uVar32 < 3);
  if (fVar72 < 0.0) {
    fVar72 = sqrtf(fVar72);
  }
  else {
    auVar41 = vsqrtss_avx(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
    fVar72 = auVar41._0_4_;
  }
  lVar20 = 0;
  auVar79 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar72)));
  do {
    auVar69 = vmulps_avx512f(auVar79,*(undefined1 (*) [64])(ipoint->descriptor + lVar20));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar20) = auVar69;
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_simd(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            float ipoint_y_sub_int_scale_add_l_mul_scale = ipoint_y_sub_int_scale + l * scale;
            int sample_y_sub_int_scale = (int) (ipoint_y_sub_int_scale_add_l_mul_scale + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                float ipoint_x_sub_int_scale_add_k_mul_scale = ipoint_x_sub_int_scale + k * scale;
                int sample_x_sub_int_scale = (int) (ipoint_x_sub_int_scale_add_k_mul_scale + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            int sample_y_sub_int_scale = (int)(ipoint_y_sub_int_scale_add_05 + l * scale);

            __m256i sample_y_sub_int_scale_vec = _mm256_set1_epi32(sample_y_sub_int_scale);

            __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
            __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
            __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

            __m256 ipoint_x_sub_int_scale_add_05_vec = _mm256_set1_ps(ipoint_x_sub_int_scale_add_05);

            // USE CVTTPS_EPI32 FOR TRUNCATION!!!
            __m256i sample_col0 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks0));
            __m256i sample_col1 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks1));
            __m256i sample_col2 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks2));
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col0, int_scale_vec, 
                                            &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col1, int_scale_vec, 
                                            &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col2, int_scale_vec, 
                                            &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}